

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O3

void __thiscall
jhu::thrax::AlignedSentencePair::AlignedSentencePair
          (AlignedSentencePair *this,Sentence *s,Sentence *t,Alignment *a)

{
  Point *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pbVar5;
  __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  _Var6;
  out_of_range *this_00;
  
  pbVar5 = (s->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (s->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (s->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (t->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = *(undefined4 *)
           ((long)&(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                   _M_impl.super__Vector_impl_data._M_start + 4);
  uVar3 = *(undefined4 *)
           &(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = *(undefined4 *)
           ((long)&(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                   _M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
    _M_impl.super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
         super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(this->alignment).
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = uVar2;
  *(undefined4 *)
   &(this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
    _M_impl.super__Vector_impl_data._M_finish = uVar3;
  *(undefined4 *)
   ((long)&(this->alignment).
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = uVar4;
  (this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (this->alignment).
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<jhu::thrax::Point_const*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_negate<jhu::thrax::AlignedSentencePair::consistent()const::_lambda(auto:1)_1_>>
                    ((this->alignment).
                     super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                     _M_impl.super__Vector_impl_data._M_start,pPVar1,this);
  if (_Var6._M_current == pPVar1) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"inconsistent aligned sentence pair");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

AlignedSentencePair(Sentence s, Sentence t, Alignment a)
      : src(std::move(s)), tgt(std::move(t)), alignment(std::move(a)) {
    if (!consistent()) {
      throw std::out_of_range("inconsistent aligned sentence pair");
    }
  }